

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall wasm::PassRunner::run(PassRunner *this)

{
  PassRunner **ppPVar1;
  pointer puVar2;
  Function *func;
  bool bVar3;
  int iVar4;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass;
  ostream *poVar5;
  pointer puVar6;
  long lVar7;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass_1;
  pointer puVar8;
  ulong uVar9;
  PassOptions *in_R8;
  size_t i;
  char *pcVar10;
  ulong uVar11;
  pointer puVar12;
  Name name;
  Name name_00;
  undefined1 auStack_3b8 [8];
  stringstream moduleBefore;
  pointer local_3a8 [48];
  undefined1 local_228 [8];
  anon_class_16_2_032a43cd flush;
  Name local_a0;
  _Head_base<0UL,_wasm::Pass_*,_false> local_90 [4];
  IString local_70;
  pointer local_60;
  char *local_58;
  double local_50;
  double local_48;
  Module *local_40;
  PassRunner *local_38;
  
  if ((run()::passDebug == '\0') && (iVar4 = __cxa_guard_acquire(&run()::passDebug), iVar4 != 0)) {
    run::passDebug = getPassDebug();
    __cxa_guard_release(&run()::passDebug);
  }
  local_38 = this;
  if ((run::passDebug == 2 | (this->options).debug) == 1) {
    pcVar10 = "passes";
    if ((this->isNested & 1U) != 0) {
      pcVar10 = "nested passes";
    }
  }
  else {
    if ((run::passDebug == 0) || (this->isNested != false)) {
      local_3a8[0] = (pointer)0x0;
      auStack_3b8 = (undefined1  [8])0x0;
      _moduleBefore = (pointer)0x0;
      puVar6 = (this->passes).
               super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_228 = (undefined1  [8])auStack_3b8;
      flush.stack = (vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> *)this;
      for (puVar8 = (this->passes).
                    super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar6; puVar8 = puVar8 + 1
          ) {
        iVar4 = (*((puVar8->_M_t).
                   super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[4])();
        if ((char)iVar4 == '\0') {
          run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)local_228);
          runPass(local_38,(puVar8->_M_t).
                           super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                           super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                           super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl);
        }
        else {
          local_90[0]._M_head_impl =
               (puVar8->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
          std::vector<wasm::Pass*,std::allocator<wasm::Pass*>>::emplace_back<wasm::Pass*>
                    ((vector<wasm::Pass*,std::allocator<wasm::Pass*>> *)auStack_3b8,
                     &local_90[0]._M_head_impl);
        }
      }
      run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)local_228);
      std::_Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>::~_Vector_base
                ((_Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> *)auStack_3b8);
      return;
    }
    pcVar10 = "passes";
  }
  local_40 = (Module *)&this->options;
  poVar5 = std::operator<<((ostream *)&std::cerr,"[PassRunner] running ");
  poVar5 = std::operator<<(poVar5,pcVar10);
  std::endl<char,std::char_traits<char>>(poVar5);
  local_60 = (this->passes).
             super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = 0;
  puVar8 = (this->passes).
           super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (puVar6 = puVar8; puVar6 != local_60; puVar6 = puVar6 + 1) {
    uVar11 = (((puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name)._M_string_length;
    if (uVar9 <= uVar11) {
      uVar9 = uVar11;
    }
  }
  local_58 = pcVar10;
  if ((2 < run::passDebug) && (this->isNested == false)) {
    Name::Name(&local_a0,"before");
    name.super_IString.str._M_str = (char *)this->wasm;
    name.super_IString.str._M_len = (size_t)local_a0.super_IString.str._M_str;
    dumpWasm((wasm *)local_a0.super_IString.str._M_len,name,local_40,in_R8);
    puVar8 = (this->passes).
             super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_60 = (this->passes).
               super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_50 = 0.0;
  for (; puVar8 != local_60; puVar8 = puVar8 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)auStack_3b8);
    if ((run::passDebug == 2) && (this->isNested == false)) {
      poVar5 = std::operator<<((ostream *)local_3a8,this->wasm);
      std::operator<<(poVar5,'\n');
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"[PassRunner]   running pass: ");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &((puVar8->_M_t).
                                      super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                      .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->
                                     name);
    std::operator<<(poVar5,"... ");
    for (uVar11 = 0;
        uVar11 < uVar9 - (((puVar8->_M_t).
                           super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                           super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                           super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name).
                         _M_string_length; uVar11 = uVar11 + 1) {
      std::operator<<((ostream *)&std::cerr,' ');
    }
    local_48 = (double)std::chrono::_V2::steady_clock::now();
    iVar4 = (*((puVar8->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[4])();
    if ((char)iVar4 == '\0') {
      runPass(local_38,(puVar8->_M_t).
                       super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl);
    }
    else {
      puVar2 = (local_38->wasm->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar12 = (local_38->wasm->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar2;
          puVar12 = puVar12 + 1) {
        func = (puVar12->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          runPassOnFunction(local_38,(puVar8->_M_t).
                                     super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                     .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl,func);
        }
      }
    }
    lVar7 = std::chrono::_V2::steady_clock::now();
    local_48 = (double)(lVar7 - (long)local_48) / 1000000000.0;
    poVar5 = std::ostream::_M_insert<double>(local_48);
    this = local_38;
    poVar5 = std::operator<<(poVar5," seconds.");
    std::endl<char,std::char_traits<char>>(poVar5);
    if (((this->options).validate == true) && (this->isNested == false)) {
      std::operator<<((ostream *)&std::cerr,"[PassRunner]   (validating)\n");
      bVar3 = WasmValidator::validate((WasmValidator *)local_228,this->wasm,(PassOptions *)local_40)
      ;
      if (!bVar3) {
        poVar5 = std::operator<<((ostream *)&std::cout,this->wasm);
        std::operator<<(poVar5,'\n');
        if (run::passDebug < 2) {
          Fatal::Fatal((Fatal *)local_228);
          std::operator<<((ostream *)&flush.this,"Last pass (");
          std::operator<<((ostream *)&flush.this,
                          (string *)
                          &((puVar8->_M_t).
                            super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t
                            .super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                            super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name);
          Fatal::operator<<((Fatal *)local_228,
                            (char (*) [128])
                            ") broke validation. Run with BINARYEN_PASS_DEBUG=2 in the env to see the earlier state, or 3 to dump byn-* files for each pass\n"
                           );
        }
        else {
          Fatal::Fatal((Fatal *)local_228);
          ppPVar1 = &flush.this;
          std::operator<<((ostream *)ppPVar1,"Last pass (");
          std::operator<<((ostream *)ppPVar1,
                          (string *)
                          &((puVar8->_M_t).
                            super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t
                            .super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                            super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name);
          std::operator<<((ostream *)ppPVar1,") broke validation. Here is the module before: \n");
          std::__cxx11::stringbuf::str();
          std::operator<<((ostream *)ppPVar1,(string *)local_90);
          Fatal::operator<<((Fatal *)local_228,(char (*) [2])0xe564bf);
          std::__cxx11::string::~string((string *)local_90);
        }
        Fatal::~Fatal((Fatal *)local_228);
      }
    }
    if (2 < run::passDebug) {
      IString::IString(&local_70,
                       &((puVar8->_M_t).
                         super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                         super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                         super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name);
      name_00.super_IString.str._M_str = (char *)this->wasm;
      name_00.super_IString.str._M_len = (size_t)local_70.str._M_str;
      dumpWasm((wasm *)local_70.str._M_len,name_00,local_40,in_R8);
    }
    local_50 = local_50 + local_48;
    std::__cxx11::stringstream::~stringstream((stringstream *)auStack_3b8);
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"[PassRunner] ");
  poVar5 = std::operator<<(poVar5,local_58);
  std::operator<<(poVar5," took ");
  poVar5 = std::ostream::_M_insert<double>(local_50);
  poVar5 = std::operator<<(poVar5," seconds.");
  std::endl<char,std::char_traits<char>>(poVar5);
  if (((this->options).validate != false) && (this->isNested == false)) {
    std::operator<<((ostream *)&std::cerr,"[PassRunner] (final validation)\n");
    bVar3 = WasmValidator::validate((WasmValidator *)auStack_3b8,this->wasm,(PassOptions *)local_40)
    ;
    if (!bVar3) {
      poVar5 = std::operator<<((ostream *)&std::cout,this->wasm);
      std::operator<<(poVar5,'\n');
      Fatal::Fatal((Fatal *)auStack_3b8);
      Fatal::operator<<((Fatal *)auStack_3b8,(char (*) [32])"final module does not validate\n");
      Fatal::~Fatal((Fatal *)auStack_3b8);
    }
  }
  return;
}

Assistant:

void PassRunner::run() {
  static const int passDebug = getPassDebug();
  // Emit logging information when asked for. At passDebug level 1+ we log
  // the main passes, while in 2 we also log nested ones. Note that for
  // nested ones we can only emit their name - we can't validate, or save the
  // file, or print, as the wasm may be in an intermediate state that is not
  // valid.
  if (options.debug || (passDebug == 2 || (passDebug && !isNested))) {
    // for debug logging purposes, run each pass in full before running the
    // other
    auto totalTime = std::chrono::duration<double>(0);
    auto what = isNested ? "nested passes" : "passes";
    std::cerr << "[PassRunner] running " << what << std::endl;
    size_t padding = 0;
    for (auto& pass : passes) {
      padding = std::max(padding, pass->name.size());
    }
    if (passDebug >= 3 && !isNested) {
      dumpWasm("before", wasm, options);
    }
    for (auto& pass : passes) {
      // ignoring the time, save a printout of the module before, in case this
      // pass breaks it, so we can print the before and after
      std::stringstream moduleBefore;
      if (passDebug == 2 && !isNested) {
        moduleBefore << *wasm << '\n';
      }
      // prepare to run
      std::cerr << "[PassRunner]   running pass: " << pass->name << "... ";
      for (size_t i = 0; i < padding - pass->name.size(); i++) {
        std::cerr << ' ';
      }
      auto before = std::chrono::steady_clock::now();
      if (pass->isFunctionParallel()) {
        // function-parallel passes should get a new instance per function
        ModuleUtils::iterDefinedFunctions(
          *wasm, [&](Function* func) { runPassOnFunction(pass.get(), func); });
      } else {
        runPass(pass.get());
      }
      auto after = std::chrono::steady_clock::now();
      std::chrono::duration<double> diff = after - before;
      std::cerr << diff.count() << " seconds." << std::endl;
      totalTime += diff;
      if (options.validate && !isNested) {
        // validate, ignoring the time
        std::cerr << "[PassRunner]   (validating)\n";
        if (!WasmValidator().validate(*wasm, options)) {
          std::cout << *wasm << '\n';
          if (passDebug >= 2) {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Here is the module before: \n"
                    << moduleBefore.str() << "\n";
          } else {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Run with BINARYEN_PASS_DEBUG=2 "
                       "in the env to see the earlier state, or 3 to dump "
                       "byn-* files for each pass\n";
          }
        }
      }
      if (passDebug >= 3) {
        dumpWasm(pass->name, wasm, options);
      }
    }
    std::cerr << "[PassRunner] " << what << " took " << totalTime.count()
              << " seconds." << std::endl;
    if (options.validate && !isNested) {
      std::cerr << "[PassRunner] (final validation)\n";
      if (!WasmValidator().validate(*wasm, options)) {
        std::cout << *wasm << '\n';
        Fatal() << "final module does not validate\n";
      }
    }
  } else {
    // non-debug normal mode, run them in an optimal manner - for locality it is
    // better to run as many passes as possible on a single function before
    // moving to the next
    std::vector<Pass*> stack;
    auto flush = [&]() {
      if (stack.size() > 0) {
        // run the stack of passes on all the functions, in parallel
        size_t num = ThreadPool::get()->size();
        std::vector<std::function<ThreadWorkState()>> doWorkers;
        std::atomic<size_t> nextFunction;
        nextFunction.store(0);
        size_t numFunctions = wasm->functions.size();
        for (size_t i = 0; i < num; i++) {
          doWorkers.push_back([&]() {
            auto index = nextFunction.fetch_add(1);
            // get the next task, if there is one
            if (index >= numFunctions) {
              return ThreadWorkState::Finished; // nothing left
            }
            Function* func = this->wasm->functions[index].get();
            if (!func->imported()) {
              // do the current task: run all passes on this function
              for (auto* pass : stack) {
                runPassOnFunction(pass, func);
              }
            }
            if (index + 1 == numFunctions) {
              return ThreadWorkState::Finished; // we did the last one
            }
            return ThreadWorkState::More;
          });
        }
        ThreadPool::get()->work(doWorkers);
      }
      stack.clear();
    };
    for (auto& pass : passes) {
      if (pass->isFunctionParallel()) {
        stack.push_back(pass.get());
      } else {
        flush();
        runPass(pass.get());
      }
    }
    flush();
  }
}